

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH54
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  ushort uVar9;
  short sVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  size_t sVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint8_t uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  char cVar34;
  ulong uVar35;
  ulong uVar36;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_f8;
  ulong local_f0;
  size_t *local_e8;
  ulong auStack_58 [5];
  
  uVar15 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  uVar3 = (position - 7) + num_bytes;
  sVar21 = position;
  if (7 < num_bytes) {
    sVar21 = uVar3;
  }
  lVar22 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar22 = 0x40;
  }
  uVar1 = position + num_bytes;
  lVar4 = *(long *)(literal_context_lut + 0x10);
  uVar32 = *(ulong *)dist_cache;
  uVar19 = lVar22 + position;
  lVar5 = *(long *)(literal_context_lut + 0x60);
  uVar8 = (uint)ringbuffer_mask;
  local_e8 = last_insert_len;
  do {
LAB_01e3e6d7:
    uVar28 = position;
    if (uVar1 <= uVar28 + 8) {
      *(ulong *)dist_cache = (uVar32 + uVar1) - uVar28;
      *(long *)commands = *(long *)commands + ((long)local_e8 - (long)last_insert_len >> 4);
      return;
    }
    local_f0 = uVar1 - uVar28;
    uVar18 = uVar15;
    if (uVar28 < uVar15) {
      uVar18 = uVar28;
    }
    uVar35 = uVar28 & ringbuffer_mask;
    puVar2 = (ulong *)(ringbuffer + uVar35);
    uVar25 = ringbuffer[uVar35];
    local_110 = (ulong)*(int *)(hasher->common).extra;
    local_f8 = 0x7e4;
    if ((uVar28 - local_110 < uVar28) &&
       (uVar11 = (uint)(uVar28 - local_110) & uVar8, uVar25 == ringbuffer[uVar11])) {
      puVar16 = (ulong *)(ringbuffer + uVar11);
      lVar30 = 0;
      puVar17 = puVar2;
      uVar27 = local_f0;
LAB_01e3e751:
      if (uVar27 < 8) {
        for (uVar36 = 0;
            (uVar27 != uVar36 &&
            (*(char *)((long)puVar16 + uVar36) == *(char *)((long)puVar17 + uVar36)));
            uVar36 = uVar36 + 1) {
        }
      }
      else {
        if (*puVar17 == *puVar16) break;
        uVar36 = *puVar16 ^ *puVar17;
        uVar27 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
        uVar36 = uVar27 >> 3 & 0x1fffffff;
      }
      uVar36 = uVar36 - lVar30;
      if ((uVar36 < 4) || (uVar27 = uVar36 * 0x87 + 0x78f, uVar27 < 0x7e5)) goto LAB_01e3e7c5;
      uVar25 = *(uint8_t *)((long)puVar2 + uVar36);
      local_f8 = uVar27;
    }
    else {
LAB_01e3e7c5:
      local_110 = 0;
      uVar36 = 0;
    }
    sVar6 = (params->dictionary).compound.num_chunks;
    lVar30 = *(long *)(ringbuffer + uVar35);
    for (lVar26 = 0; lVar26 != 0x20; lVar26 = lVar26 + 8) {
      *(ulong *)((long)auStack_58 + lVar26) =
           (ulong)((uint)((ulong)(lVar30 * -0x1ca5842ca8642d00) >> 0x2c) + (int)lVar26 & 0xfffff);
    }
    for (lVar30 = 0; lVar30 != 4; lVar30 = lVar30 + 1) {
      uVar11 = *(uint *)(sVar6 + auStack_58[lVar30] * 4);
      puVar17 = (ulong *)(ringbuffer + (uVar8 & uVar11));
      if (((uVar25 == *(uint8_t *)(uVar36 + (long)puVar17)) && (uVar28 != uVar11)) &&
         (uVar35 = uVar28 - uVar11, uVar35 <= uVar18)) {
        lVar26 = 0;
        uVar27 = local_f0;
        puVar16 = puVar2;
LAB_01e3e86f:
        if (uVar27 < 8) {
          for (uVar23 = 0;
              (uVar27 != uVar23 &&
              (*(char *)((long)puVar17 + uVar23) == *(char *)((long)puVar16 + uVar23)));
              uVar23 = uVar23 + 1) {
          }
        }
        else {
          if (*puVar16 == *puVar17) goto code_r0x01e3e880;
          uVar23 = *puVar17 ^ *puVar16;
          uVar27 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          uVar23 = uVar27 >> 3 & 0x1fffffff;
        }
        uVar23 = uVar23 - lVar26;
        if (3 < uVar23) {
          iVar12 = 0x1f;
          if ((uint)uVar35 != 0) {
            for (; (uint)uVar35 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          uVar27 = (ulong)(iVar12 * -0x1e + 0x780) + uVar23 * 0x87;
          if (local_f8 < uVar27) {
            uVar25 = *(uint8_t *)((long)puVar2 + uVar23);
            uVar36 = uVar23;
            local_110 = uVar35;
            local_f8 = uVar27;
          }
        }
      }
    }
    *(uint *)(sVar6 + *(long *)((long)auStack_58 + (ulong)((uint)uVar28 & 0x18)) * 4) = (uint)uVar28
    ;
    if (local_f8 < 0x7e5) {
      uVar32 = uVar32 + 1;
      position = uVar28 + 1;
      if (uVar19 < position) {
        if ((uint)((int)lVar22 * 4) + uVar19 < position) {
          uVar18 = uVar28 + 0x11;
          if (uVar3 <= uVar28 + 0x11) {
            uVar18 = uVar3;
          }
          for (; position < uVar18; position = position + 4) {
            *(uint *)(sVar6 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    -0x1ca5842ca8642d00) >> 0x2c) +
                                      ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
            uVar32 = uVar32 + 4;
          }
        }
        else {
          uVar18 = uVar28 + 9;
          if (uVar3 <= uVar28 + 9) {
            uVar18 = uVar3;
          }
          for (; position < uVar18; position = position + 2) {
            *(uint *)(sVar6 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    -0x1ca5842ca8642d00) >> 0x2c) +
                                      ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
            uVar32 = uVar32 + 2;
          }
        }
      }
      goto LAB_01e3e6d7;
    }
    uVar18 = (ulong)*(int *)(hasher->common).extra;
    iVar12 = 0;
    uVar19 = uVar32;
    do {
      local_f0 = local_f0 - 1;
      uVar35 = uVar36 - 1;
      if (local_f0 <= uVar36 - 1) {
        uVar35 = local_f0;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar35 = 0;
      }
      uVar27 = uVar28 + 1;
      uVar23 = uVar15;
      if (uVar27 < uVar15) {
        uVar23 = uVar27;
      }
      puVar2 = (ulong *)(ringbuffer + (uVar27 & ringbuffer_mask));
      cVar34 = *(char *)(uVar35 + (long)puVar2);
      uVar31 = uVar27 - uVar18;
      local_118 = 0x7e4;
      if ((uVar31 < uVar27) &&
         (puVar17 = (ulong *)(ringbuffer + ((uint)uVar31 & uVar8)),
         cVar34 == *(char *)(uVar35 + (long)puVar17))) {
        lVar30 = 0;
        uVar31 = local_f0;
        puVar16 = puVar2;
LAB_01e3ea86:
        if (uVar31 < 8) {
          for (uVar33 = 0;
              (uVar31 != uVar33 &&
              (*(char *)((long)puVar17 + uVar33) == *(char *)((long)puVar16 + uVar33)));
              uVar33 = uVar33 + 1) {
          }
          uVar33 = uVar33 - lVar30;
        }
        else {
          if (*puVar16 == *puVar17) goto code_r0x01e3ea97;
          uVar33 = *puVar17 ^ *puVar16;
          uVar31 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar33 = (uVar31 >> 3 & 0x1fffffff) - lVar30;
        }
        if ((uVar33 < 4) || (uVar31 = uVar33 * 0x87 + 0x78f, uVar31 < 0x7e5)) goto LAB_01e3eb17;
        cVar34 = *(char *)((long)puVar2 + uVar33);
        uVar35 = uVar33;
        local_120 = uVar18;
        local_118 = uVar31;
      }
      else {
LAB_01e3eb17:
        local_120 = 0;
      }
      lVar30 = *(long *)(ringbuffer + (uVar27 & ringbuffer_mask));
      for (lVar26 = 0; lVar26 != 0x20; lVar26 = lVar26 + 8) {
        *(ulong *)((long)auStack_58 + lVar26) =
             (ulong)((uint)((ulong)(lVar30 * -0x1ca5842ca8642d00) >> 0x2c) + (int)lVar26 & 0xfffff);
      }
      for (lVar30 = 0; lVar30 != 4; lVar30 = lVar30 + 1) {
        uVar11 = *(uint *)(sVar6 + auStack_58[lVar30] * 4);
        puVar17 = (ulong *)(ringbuffer + (uVar8 & uVar11));
        if (((cVar34 == *(char *)(uVar35 + (long)puVar17)) && (uVar27 != uVar11)) &&
           (uVar31 = uVar27 - uVar11, uVar31 <= uVar23)) {
          lVar26 = 0;
          uVar33 = local_f0;
          puVar16 = puVar2;
LAB_01e3ebbe:
          if (uVar33 < 8) {
            for (uVar24 = 0;
                (uVar33 != uVar24 &&
                (*(char *)((long)puVar17 + uVar24) == *(char *)((long)puVar16 + uVar24)));
                uVar24 = uVar24 + 1) {
            }
          }
          else {
            if (*puVar16 == *puVar17) goto code_r0x01e3ebcf;
            uVar24 = *puVar17 ^ *puVar16;
            uVar33 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            uVar24 = uVar33 >> 3 & 0x1fffffff;
          }
          uVar24 = uVar24 - lVar26;
          if (3 < uVar24) {
            iVar7 = 0x1f;
            if ((uint)uVar31 != 0) {
              for (; (uint)uVar31 >> iVar7 == 0; iVar7 = iVar7 + -1) {
              }
            }
            uVar33 = (ulong)(iVar7 * -0x1e + 0x780) + uVar24 * 0x87;
            if (local_118 < uVar33) {
              cVar34 = *(char *)((long)puVar2 + uVar24);
              uVar35 = uVar24;
              local_120 = uVar31;
              local_118 = uVar33;
            }
          }
        }
      }
      *(uint *)(sVar6 + *(long *)((long)auStack_58 + (ulong)((uint)uVar27 & 0x18)) * 4) =
           (uint)uVar27;
      uVar23 = uVar19;
      uVar31 = uVar28;
      if ((local_118 < local_f8 + 0xaf) ||
         (local_110 = local_120, uVar23 = uVar32 + 4, uVar31 = uVar27, uVar36 = uVar35, iVar12 == 3)
         ) break;
      uVar23 = uVar19 + 1;
      iVar12 = iVar12 + 1;
      uVar35 = uVar28 + 9;
      local_f8 = local_118;
      uVar28 = uVar27;
      uVar19 = uVar23;
    } while (uVar35 < uVar1);
    uVar19 = lVar4 + uVar31;
    if (uVar15 <= lVar4 + uVar31) {
      uVar19 = uVar15;
    }
    if (uVar19 + lVar5 < local_110) {
LAB_01e3ed03:
      uVar28 = local_110 + 0xf;
LAB_01e3ed07:
      if ((local_110 <= uVar19 + lVar5) && (uVar28 != 0)) {
        *(undefined4 *)((long)(hasher->common).extra + 0xc) =
             *(undefined4 *)((hasher->common).extra + 1);
        *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
        *(int *)(hasher->common).extra = (int)local_110;
      }
    }
    else {
      uVar32 = (ulong)*(int *)(hasher->common).extra;
      if (local_110 != uVar32) {
        uVar18 = (ulong)*(int *)((long)(hasher->common).extra + 4);
        uVar28 = 1;
        if (local_110 != uVar18) {
          uVar32 = (local_110 + 3) - uVar32;
          if (uVar32 < 7) {
            bVar20 = (byte)((int)uVar32 << 2);
            uVar11 = 0x9750468;
          }
          else {
            uVar18 = (local_110 + 3) - uVar18;
            if (6 < uVar18) {
              uVar28 = 2;
              if ((local_110 != (long)*(int *)((hasher->common).extra + 1)) &&
                 (uVar28 = 3, local_110 != (long)*(int *)((long)(hasher->common).extra + 0xc)))
              goto LAB_01e3ed03;
              goto LAB_01e3ed07;
            }
            bVar20 = (byte)((int)uVar18 << 2);
            uVar11 = 0xfdb1ace;
          }
          uVar28 = (ulong)(uVar11 >> (bVar20 & 0x1f) & 0xf);
        }
        goto LAB_01e3ed07;
      }
      uVar28 = 0;
    }
    uVar11 = (uint)uVar23;
    *(uint *)local_e8 = uVar11;
    uVar14 = (uint)uVar36;
    *(uint *)((long)local_e8 + 4) = uVar14;
    uVar19 = (ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10;
    uVar13 = 0;
    if (uVar19 <= uVar28) {
      bVar20 = (byte)*(uint *)(literal_context_lut + 0x38);
      uVar32 = ((4L << (bVar20 & 0x3f)) + (uVar28 - *(uint *)(literal_context_lut + 0x3c))) - 0x10;
      uVar13 = 0x1f;
      uVar29 = (uint)uVar32;
      if (uVar29 != 0) {
        for (; uVar29 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = (uVar13 ^ 0xffffffe0) + 0x1f;
      uVar18 = (ulong)((uVar32 >> ((ulong)uVar13 & 0x3f) & 1) != 0);
      lVar30 = (ulong)uVar13 - (ulong)*(uint *)(literal_context_lut + 0x38);
      uVar28 = (~(-1 << (bVar20 & 0x1f)) & uVar29) + uVar19 +
               (uVar18 + lVar30 * 2 + 0xfffe << (bVar20 & 0x3f)) | lVar30 * 0x400;
      uVar13 = (uint)(uVar32 - (uVar18 + 2 << ((byte)uVar13 & 0x3f)) >> (bVar20 & 0x3f));
    }
    *(short *)((long)local_e8 + 0xe) = (short)uVar28;
    *(uint *)(local_e8 + 1) = uVar13;
    if (5 < uVar23) {
      if (uVar23 < 0x82) {
        uVar11 = 0x1f;
        uVar13 = (uint)(uVar23 - 2);
        if (uVar13 != 0) {
          for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar11 = (int)(uVar23 - 2 >> ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar11 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (uVar23 < 0x842) {
        uVar13 = 0x1f;
        if (uVar11 - 0x42 != 0) {
          for (; uVar11 - 0x42 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar11 = (uVar13 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar11 = 0x15;
        if (0x1841 < uVar23) {
          uVar11 = (uint)(ushort)(0x17 - (uVar23 < 0x5842));
        }
      }
    }
    uVar19 = (ulong)(int)uVar14;
    if (uVar19 < 10) {
      uVar13 = uVar14 - 2;
    }
    else if (uVar19 < 0x86) {
      uVar13 = 0x1f;
      uVar14 = (uint)(uVar19 - 6);
      if (uVar14 != 0) {
        for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = (int)(uVar19 - 6 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar13 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar13 = 0x17;
      if (uVar19 < 0x846) {
        uVar13 = 0x1f;
        if (uVar14 - 0x46 != 0) {
          for (; uVar14 - 0x46 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = (uVar13 ^ 0xffe0) + 0x2c;
      }
    }
    uVar9 = (ushort)uVar13;
    sVar10 = (uVar9 & 7) + ((ushort)uVar11 & 7) * 8;
    if ((((uVar28 & 0x3ff) == 0) && ((ushort)uVar11 < 8)) && (uVar9 < 0x10)) {
      if (7 < uVar9) {
        sVar10 = sVar10 + 0x40;
      }
    }
    else {
      iVar12 = ((uVar11 & 0xffff) >> 3) * 3 + ((uVar13 & 0xffff) >> 3);
      sVar10 = sVar10 + ((ushort)(0x520d40 >> ((char)iVar12 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar12 * 0x40 + 0x40;
    }
    *(short *)((long)local_e8 + 0xc) = sVar10;
    *num_commands = *num_commands + uVar23;
    position = uVar36 + uVar31;
    uVar32 = sVar21;
    if (position < sVar21) {
      uVar32 = position;
    }
    uVar28 = uVar31 + 2;
    if (local_110 < uVar36 >> 2) {
      uVar19 = position + local_110 * -4;
      if (uVar19 < uVar28) {
        uVar19 = uVar28;
      }
      uVar28 = uVar19;
      if (uVar32 < uVar19) {
        uVar28 = uVar32;
      }
    }
    uVar19 = uVar31 + lVar22 + uVar36 * 2;
    local_e8 = local_e8 + 2;
    for (; uVar28 < uVar32; uVar28 = uVar28 + 1) {
      *(uint *)(sVar6 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar28 & ringbuffer_mask)) *
                                              -0x1ca5842ca8642d00) >> 0x2c) + ((uint)uVar28 & 0x18)
                               & 0xfffff) * 4) = (uint)uVar28;
    }
    uVar32 = 0;
  } while( true );
  puVar17 = puVar17 + 1;
  puVar16 = puVar16 + 1;
  uVar27 = uVar27 - 8;
  lVar30 = lVar30 + -8;
  goto LAB_01e3e751;
code_r0x01e3e880:
  puVar16 = puVar16 + 1;
  puVar17 = puVar17 + 1;
  uVar27 = uVar27 - 8;
  lVar26 = lVar26 + -8;
  goto LAB_01e3e86f;
code_r0x01e3ea97:
  puVar16 = puVar16 + 1;
  puVar17 = puVar17 + 1;
  uVar31 = uVar31 - 8;
  lVar30 = lVar30 + -8;
  goto LAB_01e3ea86;
code_r0x01e3ebcf:
  puVar16 = puVar16 + 1;
  puVar17 = puVar17 + 1;
  uVar33 = uVar33 - 8;
  lVar26 = lVar26 + -8;
  goto LAB_01e3ebbe;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}